

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_pvrtc1_4.h
# Opt level: O0

uint64_t __thiscall
basisu::pvrtc4_image::map_pixel
          (pvrtc4_image *this,uint32_t x,uint32_t y,color_rgba *c,bool perceptual,
          bool alpha_is_significant,bool record)

{
  uint32_t uVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  color_rgba *in_RDI;
  byte in_R8B;
  uint32_t in_R9D;
  uint32_t unaff_retaddr;
  uint32_t unaff_retaddr_00;
  byte in_stack_00000008;
  undefined7 in_stack_00000009;
  uint64_t dist;
  uint32_t i;
  uint32_t best_v;
  uint64_t best_dist;
  color_rgba v [4];
  undefined4 in_stack_ffffffffffffff90;
  color_rgba *e2;
  color_rgba *this_00;
  ulong in_stack_ffffffffffffffb0;
  uint local_48;
  ulong local_40;
  color_rgba local_38 [4];
  color_rgba acStack_28 [3];
  byte local_1b;
  byte local_1a;
  byte local_19;
  color_rgba *pColors;
  
  local_19 = in_R8B & 1;
  local_1a = (byte)in_R9D & 1;
  local_1b = in_stack_00000008 & 1;
  this_00 = local_38;
  e2 = acStack_28;
  pColors = in_RDI;
  do {
    color_rgba::color_rgba(this_00);
    this_00 = this_00 + 1;
  } while (this_00 != e2);
  get_interpolated_colors
            ((pvrtc4_image *)CONCAT71(in_stack_00000009,in_stack_00000008),unaff_retaddr_00,
             unaff_retaddr,pColors);
  uVar1 = color_distance(SUB81(in_stack_ffffffffffffffb0 >> 0x18,0),this_00,e2,
                         SUB81((ulong)in_RDI >> 0x38,0));
  local_40 = (ulong)uVar1;
  for (local_48 = 1; local_48 < 4; local_48 = local_48 + 1) {
    uVar1 = color_distance(SUB81(in_stack_ffffffffffffffb0 >> 0x18,0),this_00,e2,
                           SUB81((ulong)in_RDI >> 0x38,0));
    in_stack_ffffffffffffffb0 = (ulong)uVar1;
    if (in_stack_ffffffffffffffb0 < local_40) {
      local_40 = in_stack_ffffffffffffffb0;
    }
  }
  if ((local_1b & 1) != 0) {
    set_modulation((pvrtc4_image *)CONCAT44(in_EDX,in_stack_ffffffffffffff90),
                   (uint32_t)((ulong)in_RCX >> 0x20),(uint32_t)in_RCX,in_R9D);
  }
  return local_40;
}

Assistant:

inline uint64_t map_pixel(uint32_t x, uint32_t y, const color_rgba& c, bool perceptual, bool alpha_is_significant, bool record = true)
		{
			color_rgba v[4];
			get_interpolated_colors(x, y, v);

			uint64_t best_dist = color_distance(perceptual, c, v[0], alpha_is_significant);
			uint32_t best_v = 0;
			for (uint32_t i = 1; i < 4; i++)
			{
				uint64_t dist = color_distance(perceptual, c, v[i], alpha_is_significant);
				if (dist < best_dist)
				{
					best_dist = dist;
					best_v = i;
				}
			}

			if (record)
				set_modulation(x, y, best_v);

			return best_dist;
		}